

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall StatusPrinter::StatusPrinter(StatusPrinter *this,BuildConfig *config)

{
  char *pcVar1;
  char *pcVar2;
  
  (this->super_Status)._vptr_Status = (_func_int **)&PTR_PlanHasTotalEdges_00133bf0;
  this->config_ = config;
  this->started_edges_ = 0;
  this->finished_edges_ = 0;
  this->total_edges_ = 0;
  this->running_edges_ = 0;
  this->time_millis_ = 0;
  LinePrinter::LinePrinter(&this->printer_);
  this->progress_status_format_ = (char *)0x0;
  SlidingRateInfo::SlidingRateInfo(&this->current_rate_,*(int *)(config + 8));
  if (*(int *)this->config_ != 2) {
    (this->printer_).smart_terminal_ = false;
  }
  pcVar1 = getenv("NINJA_STATUS");
  pcVar2 = "[%f/%t] ";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  this->progress_status_format_ = pcVar2;
  return;
}

Assistant:

StatusPrinter::StatusPrinter(const BuildConfig& config)
    : config_(config),
      started_edges_(0), finished_edges_(0), total_edges_(0), running_edges_(0),
      time_millis_(0), progress_status_format_(NULL),
      current_rate_(config.parallelism) {

  // Don't do anything fancy in verbose mode.
  if (config_.verbosity != BuildConfig::NORMAL)
    printer_.set_smart_terminal(false);

  progress_status_format_ = getenv("NINJA_STATUS");
  if (!progress_status_format_)
    progress_status_format_ = "[%f/%t] ";
}